

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::ServiceDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  _func_int **pp_Var1;
  MessageLite *to_msg_00;
  ulong uVar2;
  void *pvVar3;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar4;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_00210913:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_00210891:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,arena);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::MethodDescriptorProto>);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_002108c1;
    if ((unaff_EBP & 1) != 0) {
      pp_Var1 = from_msg[3]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)((ulong)pp_Var1 & 0xfffffffffffffffc);
      pMVar4 = to_msg + 3;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_00210913;
      goto LAB_00210891;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((ServiceDescriptorProto *)&stack0xffffffffffffffd0);
    }
    to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar3 = Arena::CopyConstruct<google::protobuf::ServiceOptions>(arena_00,pMVar4);
      to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
    }
    else {
      ServiceOptions::MergeImpl(to_msg_00,pMVar4);
    }
  }
LAB_002108c1:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void ServiceDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ServiceDescriptorProto*>(&to_msg);
  auto& from = static_cast<const ServiceDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_method()->MergeFrom(
      from._internal_method());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}